

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryUpdate<duckdb::ArgMinMaxState<int,duckdb::string_t>,int,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,data_ptr_t state,idx_t count
               )

{
  UnifiedVectorFormat bdata;
  string_t *local_b0;
  ValidityMask local_a8;
  UnifiedVectorFormat adata;
  int *local_68;
  ValidityMask local_60;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
  duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
  BinaryUpdateLoop<duckdb::ArgMinMaxState<int,duckdb::string_t>,int,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
            (local_68,aggr_input_data,local_b0,(ArgMinMaxState<int,_duckdb::string_t> *)state,count,
             _adata,_bdata,&local_60,&local_a8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&bdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&adata);
  return;
}

Assistant:

static void BinaryUpdate(AggregateInputData &aggr_input_data, Vector &a, Vector &b, data_ptr_t state, idx_t count) {
		UnifiedVectorFormat adata, bdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);

		BinaryUpdateLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE *)state, count, *adata.sel, *bdata.sel, adata.validity, bdata.validity);
	}